

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

int __thiscall CheaterBotStrategy::cheaterAttack(CheaterBotStrategy *this)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  Country *toExchange;
  int iVar4;
  bool bVar5;
  ostream *poVar6;
  GameLoop *pGVar7;
  pointer ppPVar8;
  pointer ppCVar9;
  Player *defendingPlayer;
  pointer ppCVar10;
  string local_50;
  
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "We have a cheater! They are conquering all their neighbouring countries"
                          );
  std::endl<char,std::char_traits<char>>(poVar6);
  pvVar1 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
  ppCVar9 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar2 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppCVar9 == ppCVar2) {
      iVar4 = 1;
LAB_00118cae:
      Player::setPlayerState((this->super_PlayerStrategy).player,IDLE);
      (*((this->super_PlayerStrategy).player)->strategy->_vptr_PlayerStrategy[5])();
      return iVar4;
    }
    ppCVar3 = ((*ppCVar9)->pAdjCountries->
              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar10 = ((*ppCVar9)->pAdjCountries->
                    super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                    super__Vector_impl_data._M_start; ppCVar10 != ppCVar3; ppCVar10 = ppCVar10 + 1)
    {
      toExchange = *ppCVar10;
      if (*toExchange->pPlayerOwnerId != *((this->super_PlayerStrategy).player)->pPlayerId) {
        pGVar7 = GameLoop::getInstance();
        defendingPlayer = (Player *)0x0;
        for (ppPVar8 = (pGVar7->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)
                       ._M_impl.super__Vector_impl_data._M_start;
            ppPVar8 !=
            (pGVar7->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
            super__Vector_impl_data._M_finish; ppPVar8 = ppPVar8 + 1) {
          if (*(*ppPVar8)->pPlayerId == *toExchange->pPlayerOwnerId) {
            defendingPlayer = *ppPVar8;
          }
        }
        if (defendingPlayer != (Player *)0x0) {
          bVar5 = exchangeCountryOwnership(this,defendingPlayer,toExchange);
          if (bVar5) {
            poVar6 = std::operator<<((ostream *)&std::cout,"[CHEATER] - Country ");
            Map::Country::getCountryName_abi_cxx11_(&local_50,toExchange);
            poVar6 = std::operator<<(poVar6,(string *)&local_50);
            poVar6 = std::operator<<(poVar6," has been attacked & conquered by Player ");
            poVar6 = (ostream *)
                     std::ostream::operator<<
                               (poVar6,*((this->super_PlayerStrategy).player)->pPlayerId);
            std::operator<<(poVar6," -\n");
            std::__cxx11::string::~string((string *)&local_50);
            goto LAB_00118c90;
          }
        }
        iVar4 = -1;
        goto LAB_00118cae;
      }
LAB_00118c90:
    }
    ppCVar9 = ppCVar9 + 1;
  } while( true );
}

Assistant:

int CheaterBotStrategy::cheaterAttack() {
    std::cout << "We have a cheater! They are conquering all their neighbouring countries" << std::endl;
    for (auto* country : *this->player->getOwnedCountries()) {
        for (auto* neighbour : *country->getAdjCountries()) {
            if (neighbour->getPlayerOwnerID() == this->player->getPlayerId()) {
                continue;
            }
            Player* defendingPlayer = nullptr;
            for (auto* i : *GameLoop::getInstance()->getAllPlayers()) {
                if (i->getPlayerId() == neighbour->getPlayerOwnerID()) {
                    defendingPlayer = i;
                }
            }
            if (defendingPlayer == nullptr) {
                player->setPlayerState(PlayerState::IDLE);
                player->getStrategy()->resetChoices();
                return PlayerAction::FAILED;
            }
            if (exchangeCountryOwnership(defendingPlayer, neighbour)) {
                std::cout << "[CHEATER] - Country " << neighbour->getCountryName() << " has been attacked & conquered by Player " << this->player->getPlayerId() << " -\n";
                continue;
            } else {
                player->setPlayerState(PlayerState::IDLE);
                player->getStrategy()->resetChoices();
                return PlayerAction::FAILED;
            }
        }
    }
    player->setPlayerState(PlayerState::IDLE);
    player->getStrategy()->resetChoices();
    return PlayerAction::SUCCEEDED;
}